

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_internal_serialise_particle_to_buffer(mcpl_particle_t *particle,mcpl_outfileinternal_t *f)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  undefined8 auStack_bc [13];
  code *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  double pack_ekindir [3];
  
  if (1e-05 < ABS(particle->direction[2] * particle->direction[2] +
                  particle->direction[0] * particle->direction[0] +
                  particle->direction[1] * particle->direction[1] + -1.0)) {
    pcStack_50 = (code *)0x1034c5;
    mcpl_error("attempting to add particle with non-unit direction vector");
  }
  local_48 = particle->ekin;
  uStack_40 = 0;
  if (0.0 <= local_48) {
    pcStack_50 = (code *)0x1032e5;
    mcpl_unitvect_pack_adaptproj(particle->direction,pack_ekindir);
    pack_ekindir[2]._0_4_ = (undefined4)local_48;
    pack_ekindir[2]._4_4_ = pack_ekindir[2]._4_4_ & 0x80000000 | local_48._4_4_ & 0x7fffffff;
    if (f->opt_singleprec == 0) {
      if (f->opt_polarisation == 0) {
        lVar2 = 0;
      }
      else {
        lVar2 = 0x18;
        for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
          *(double *)(f->particle_buffer + lVar3 * 8) = particle->polarisation[lVar3];
        }
      }
      for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
        *(undefined8 *)(f->particle_buffer + lVar3 + lVar2) =
             *(undefined8 *)((long)particle->position + lVar3);
      }
      for (lVar3 = 0x84; lVar3 != 0x9c; lVar3 = lVar3 + 8) {
        *(undefined8 *)(f->particle_buffer + lVar3 + lVar2 + -0x6c) =
             *(undefined8 *)((long)auStack_bc + lVar3);
      }
      *(double *)(f->particle_buffer + lVar2 + 0x30) = particle->time;
      if ((f->opt_universalweight != 0.0) || (NAN(f->opt_universalweight))) {
        uVar1 = (int)lVar2 + 0x38;
      }
      else {
        *(double *)(f->particle_buffer + lVar2 + 0x38) = particle->weight;
        uVar1 = (int)lVar2 + 0x40;
      }
    }
    else {
      if (f->opt_polarisation == 0) {
        lVar2 = 0;
      }
      else {
        lVar2 = 0xc;
        for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
          *(float *)(f->particle_buffer + lVar3 * 4) = (float)particle->polarisation[lVar3];
        }
      }
      for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
        *(float *)(f->particle_buffer + lVar3 + lVar2 + 0x84 + -0x84) =
             (float)*(double *)((long)particle->position + lVar3 * 2);
      }
      for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
        *(float *)(f->particle_buffer + lVar3 + lVar2 + 0x84 + -0x78) =
             (float)*(double *)((long)pack_ekindir + lVar3 * 2);
      }
      *(float *)(f->particle_buffer + lVar2 + 0x18) = (float)particle->time;
      if ((f->opt_universalweight != 0.0) || (NAN(f->opt_universalweight))) {
        uVar1 = (int)lVar2 + 0x1c;
      }
      else {
        *(float *)(f->particle_buffer + lVar2 + 0x1c) = (float)particle->weight;
        uVar1 = (int)lVar2 + 0x20;
      }
    }
    if (f->opt_universalpdgcode == 0) {
      *(int32_t *)(f->particle_buffer + uVar1) = particle->pdgcode;
      uVar1 = uVar1 + 4;
    }
    if (f->opt_userflags != 0) {
      *(uint32_t *)(f->particle_buffer + uVar1) = particle->userflags;
    }
    return;
  }
  pcStack_50 = mcpl_internal_write_particle_buffer_to_file;
  mcpl_error("attempting to add particle with negative kinetic energy");
}

Assistant:

MCPL_LOCAL void mcpl_internal_serialise_particle_to_buffer( const mcpl_particle_t* particle,
                                                            mcpl_outfileinternal_t * f ) {

  //Serialise the provided particle into the particle_buffer of the output file
  //(according to the settings of the output file).

  double pack_ekindir[3];

  //Sanity check (add more??):
  double dirsq = particle->direction[0] * particle->direction[0]
    + particle->direction[1] * particle->direction[1]
    + particle->direction[2] * particle->direction[2];
  if (fabs(dirsq-1.0)>1.0e-5)
    mcpl_error("attempting to add particle with non-unit direction vector");
  if (particle->ekin<0.0)
    mcpl_error("attempting to add particle with negative kinetic energy");
  //direction and ekin are packed into 3 doubles:
  mcpl_unitvect_pack_adaptproj(particle->direction,pack_ekindir);
  //pack_ekindir[2] is now just a sign(1.0 or -1.0), so we can store the
  //ekin in that field as well (since it must be non-negative). We use copysign
  //to be sure the signbit is set also if ekin=0:
  pack_ekindir[2] = copysign(particle->ekin,pack_ekindir[2]);

  //serialise particle object to buffer:
  unsigned ibuf = 0;
  char * pbuf = &(f->particle_buffer[0]);
  int i;
  if (f->opt_singleprec) {
    if (f->opt_polarisation) {
      for (i=0;i<3;++i) {
        *(float*)&pbuf[ibuf] = (float)particle->polarisation[i];
        ibuf += sizeof(float);
      }
    }
    for (i=0;i<3;++i) {
      *(float*)&pbuf[ibuf] = (float)particle->position[i];
      ibuf += sizeof(float);
    }
    for (i=0;i<3;++i) {
      *(float*)&pbuf[ibuf] = (float)pack_ekindir[i];
      ibuf += sizeof(float);
    }
    *(float*)&pbuf[ibuf] = (float)particle->time;
    ibuf += sizeof(float);
    if (!f->opt_universalweight) {
      *(float*)&pbuf[ibuf] = (float)particle->weight;
      ibuf += sizeof(float);
    }
  } else {
    if (f->opt_polarisation) {
      for (i=0;i<3;++i) {
        *(double*)&pbuf[ibuf] = particle->polarisation[i];
        ibuf += sizeof(double);
      }
    }
    for (i=0;i<3;++i) {
      *(double*)&pbuf[ibuf] = particle->position[i];
      ibuf += sizeof(double);
    }
    for (i=0;i<3;++i) {
      *(double*)&pbuf[ibuf] = pack_ekindir[i];
      ibuf += sizeof(double);
    }
    *(double*)&pbuf[ibuf] = particle->time;
    ibuf += sizeof(double);
    if (!f->opt_universalweight) {
      *(double*)&pbuf[ibuf] = particle->weight;
      ibuf += sizeof(double);
    }
  }
  if (!f->opt_universalpdgcode) {
    *(int32_t*)&pbuf[ibuf] = particle->pdgcode;
    ibuf += sizeof(int32_t);
  }
  if (f->opt_userflags) {
    *(uint32_t*)&pbuf[ibuf] = particle->userflags;
#ifndef NDEBUG
    ibuf += sizeof(uint32_t);
#endif
  }
  assert(ibuf==f->particle_size);
}